

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::CreateRuleFile(cmMakefileTargetGenerator *this)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  int iVar1;
  cmGeneratedFileStream *pcVar2;
  allocator local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  string local_40;
  
  (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
            (&local_40,this->LocalGenerator,this->Target);
  std::__cxx11::string::operator=((string *)&this->TargetBuildDirectory,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  cmLocalUnixMakefileGenerator3::ConvertToFullPath
            (&local_40,this->LocalGenerator,&this->TargetBuildDirectory);
  std::__cxx11::string::operator=((string *)&this->TargetBuildDirectoryFull,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  cmsys::SystemTools::MakeDirectory((this->TargetBuildDirectoryFull)._M_dataplus._M_p);
  std::__cxx11::string::_M_assign((string *)&this->BuildFileName);
  std::__cxx11::string::append((char *)&this->BuildFileName);
  std::__cxx11::string::_M_assign((string *)&this->BuildFileNameFull);
  std::__cxx11::string::append((char *)&this->BuildFileNameFull);
  std::__cxx11::string::_M_assign((string *)&this->ProgressFileNameFull);
  std::__cxx11::string::append((char *)&this->ProgressFileNameFull);
  this->NumberOfProgressActions = 0;
  pcVar2 = (cmGeneratedFileStream *)operator_new(0x248);
  cmGeneratedFileStream::cmGeneratedFileStream
            (pcVar2,(this->BuildFileNameFull)._M_dataplus._M_p,false);
  this->BuildFileStream = pcVar2;
  cmGeneratedFileStream::SetCopyIfDifferent(pcVar2,true);
  if (this->BuildFileStream != (cmGeneratedFileStream *)0x0) {
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              (this->LocalGenerator,(ostream *)this->BuildFileStream);
    iVar1 = (*(this->GlobalGenerator->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x27])();
    if ((char)iVar1 != '\0') {
      no_depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      no_depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      no_depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      no_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this_00 = this->LocalGenerator;
      pcVar2 = this->BuildFileStream;
      std::__cxx11::string::string((string *)&local_40,".DELETE_ON_ERROR",&local_79);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (this_00,(ostream *)pcVar2,"Delete rule output on recipe failure.",&local_40,
                 &no_depends,&no_commands,false,false);
      std::__cxx11::string::~string((string *)&local_40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&no_commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&no_depends);
    }
    cmLocalUnixMakefileGenerator3::WriteSpecialTargetsTop
              (this->LocalGenerator,(ostream *)this->BuildFileStream);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateRuleFile()
{
  // Create a directory for this target.
  this->TargetBuildDirectory =
    this->LocalGenerator->GetTargetDirectory(*this->Target);
  this->TargetBuildDirectoryFull =
    this->LocalGenerator->ConvertToFullPath(this->TargetBuildDirectory);
  cmSystemTools::MakeDirectory(this->TargetBuildDirectoryFull.c_str());

  // Construct the rule file name.
  this->BuildFileName = this->TargetBuildDirectory;
  this->BuildFileName += "/build.make";
  this->BuildFileNameFull = this->TargetBuildDirectoryFull;
  this->BuildFileNameFull += "/build.make";

  // Construct the rule file name.
  this->ProgressFileNameFull = this->TargetBuildDirectoryFull;
  this->ProgressFileNameFull += "/progress.make";

  // reset the progress count
  this->NumberOfProgressActions = 0;

  // Open the rule file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->BuildFileStream =
    new cmGeneratedFileStream(this->BuildFileNameFull.c_str());
  this->BuildFileStream->SetCopyIfDifferent(true);
  if(!this->BuildFileStream)
    {
    return;
    }
  this->LocalGenerator->WriteDisclaimer(*this->BuildFileStream);
  if (this->GlobalGenerator->AllowDeleteOnError())
    {
    std::vector<std::string> no_depends;
    std::vector<std::string> no_commands;
    this->LocalGenerator->WriteMakeRule(
      *this->BuildFileStream, "Delete rule output on recipe failure.",
      ".DELETE_ON_ERROR", no_depends, no_commands, false);
    }
  this->LocalGenerator->WriteSpecialTargetsTop(*this->BuildFileStream);
}